

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O3

int32_t icu_63::CollationFastLatin::compareUTF16
                  (uint16_t *table,uint16_t *primaries,int32_t options,UChar *left,
                  int32_t leftLength,UChar *right,int32_t rightLength)

{
  uint16_t *table_00;
  UChar UVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint16_t *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint32_t uVar11;
  bool bVar12;
  bool bVar13;
  int32_t leftIndex;
  int32_t local_60;
  int32_t local_5c;
  int local_58;
  uint local_54;
  uint16_t *local_50;
  UChar *local_48;
  uint local_3c;
  uint16_t *local_38;
  
  table_00 = table + (byte)*table;
  uVar8 = (uint)options >> 0x10;
  local_3c = options & 0xffff;
  local_5c = 0;
  local_60 = 0;
  local_50 = table + ((ulong)(byte)*table - 0x1e80);
  uVar11 = 0;
  local_58 = leftLength;
  local_54 = options;
  local_48 = right;
  local_38 = primaries;
  uVar2 = 0;
LAB_0023349c:
  do {
    if (uVar2 == 0) {
      lVar5 = (long)local_5c;
      if (local_5c == local_58) {
        uVar2 = 2;
      }
      else {
        local_5c = local_5c + 1;
        UVar1 = left[lVar5];
        uVar9 = (ulong)(ushort)UVar1;
        if ((ushort)UVar1 < 0x180) {
          uVar2 = (uint32_t)local_38[uVar9];
          if (local_38[uVar9] == 0) {
            puVar6 = table_00;
            if (((local_54 & 2) != 0) && (0xfff5 < (ushort)(UVar1 + L'ￆ'))) {
              return -2;
            }
LAB_0023351a:
            uVar3 = (uint)puVar6[uVar9];
LAB_0023351e:
            uVar4 = uVar3;
            if (uVar3 < 0x1000) goto LAB_0023352e;
            uVar2 = uVar3 & 0xfc00;
          }
        }
        else {
          puVar6 = local_50;
          if (((UVar1 & 0xffc0U) == 0x2000) || (((ushort)UVar1 & 0xffffffc0) == 0x2000))
          goto LAB_0023351a;
          uVar3 = 1;
          if (uVar9 == 0xffff) {
            uVar3 = 0xfca8;
          }
          uVar4 = 3;
          if (uVar9 != 0xfffe) goto LAB_0023351e;
LAB_0023352e:
          if (uVar4 <= uVar8) {
            uVar2 = nextPair(table_00,(uint)(ushort)UVar1,uVar4,left,(uint8_t *)0x0,&local_5c,
                             &local_58);
            if (uVar2 == 1) {
              return -2;
            }
            uVar3 = uVar2 & 0xffff;
            if (uVar3 < 0x1000) {
              if (uVar8 < uVar3) {
                uVar2 = uVar2 & 0xfff8fff8;
              }
              else if (0xbff < uVar3) {
                uVar2 = 0;
              }
            }
            else {
              uVar2 = uVar2 & 0xfc00fc00;
            }
            goto LAB_0023349c;
          }
          uVar2 = uVar4 & 0xff8;
        }
      }
    }
    while (uVar11 == 0) {
      lVar5 = (long)local_60;
      if (local_60 == rightLength) {
        uVar11 = 2;
        break;
      }
      local_60 = local_60 + 1;
      UVar1 = local_48[lVar5];
      uVar9 = (ulong)(ushort)UVar1;
      if ((ushort)UVar1 < 0x180) {
        uVar11 = (uint32_t)local_38[uVar9];
        if (local_38[uVar9] != 0) break;
        puVar6 = table_00;
        if (((local_54 & 2) != 0) && (0xfff5 < (ushort)(UVar1 + L'ￆ'))) {
          return -2;
        }
LAB_0023365f:
        uVar3 = (uint)puVar6[uVar9];
LAB_00233663:
        uVar4 = uVar3;
        if (0xfff < uVar3) {
          uVar11 = uVar3 & 0xfc00;
          break;
        }
      }
      else {
        puVar6 = local_50;
        if (((UVar1 & 0xffc0U) == 0x2000) || (((ushort)UVar1 & 0xffffffc0) == 0x2000))
        goto LAB_0023365f;
        uVar3 = 1;
        if (uVar9 == 0xffff) {
          uVar3 = 0xfca8;
        }
        uVar4 = 3;
        if (uVar9 != 0xfffe) goto LAB_00233663;
      }
      if (uVar8 < uVar4) {
        uVar11 = uVar4 & 0xff8;
        break;
      }
      uVar11 = nextPair(table_00,(uint)(ushort)UVar1,uVar4,local_48,(uint8_t *)0x0,&local_60,
                        &rightLength);
      if (uVar11 == 1) {
        return -2;
      }
      uVar3 = uVar11 & 0xffff;
      if (uVar3 < 0x1000) {
        if (uVar8 < uVar3) {
          uVar11 = uVar11 & 0xfff8fff8;
        }
        else if (0xbff < uVar3) {
          uVar11 = 0;
        }
      }
      else {
        uVar11 = uVar11 & 0xfc00fc00;
      }
    }
    if (uVar2 != uVar11) {
      uVar3 = uVar2 & 0xffff;
      uVar4 = uVar11 & 0xffff;
      if (uVar3 != uVar4) goto LAB_00233ded;
      if (uVar2 == 2) break;
      uVar11 = uVar11 >> 0x10;
      uVar2 = uVar2 >> 0x10;
      goto LAB_0023349c;
    }
    uVar11 = 0;
    bVar12 = uVar2 != 2;
    uVar2 = 0;
  } while (bVar12);
  if (0xfff < local_3c) {
    uVar11 = 0;
    local_60 = 0;
    local_5c = 0;
    uVar2 = 0;
joined_r0x0023399f:
    do {
      uVar10 = uVar2;
      if (uVar2 == 0) {
        lVar5 = (long)local_5c;
        if (local_5c == local_58) {
          uVar10 = 2;
        }
        else {
          local_5c = local_5c + 1;
          uVar3 = (uint)(ushort)left[lVar5];
          puVar6 = table_00;
          if ((uVar3 < 0x180) || (puVar6 = local_50, (uVar3 & 0xffffffc0) == 0x2000)) {
            uVar4 = (uint)puVar6[uVar3];
LAB_00233a2a:
            uVar10 = uVar4;
            if (0xfff < uVar4) {
              uVar4 = uVar4 & 0x3e0;
              uVar10 = uVar4 * 0x10000 + 0x2000c0;
              if (uVar4 < 0x180) {
                uVar10 = uVar4 + 0x20;
              }
              goto joined_r0x002339a4;
            }
          }
          else {
            uVar4 = 1;
            if (uVar3 == 0xffff) {
              uVar4 = 0xfca8;
            }
            uVar10 = 3;
            if (uVar3 != 0xfffe) goto LAB_00233a2a;
          }
          if (uVar10 <= uVar8) {
            uVar2 = nextPair(table_00,uVar3,uVar10,left,(uint8_t *)0x0,&local_5c,&local_58);
            uVar2 = getSecondaries(uVar8,uVar2);
            goto joined_r0x0023399f;
          }
          uVar10 = 0xc0;
        }
      }
joined_r0x002339a4:
      while (uVar11 == 0) {
        lVar5 = (long)local_60;
        if (local_60 == rightLength) {
          uVar11 = 2;
          break;
        }
        local_60 = local_60 + 1;
        uVar3 = (uint)(ushort)local_48[lVar5];
        puVar6 = table_00;
        if ((uVar3 < 0x180) || (puVar6 = local_50, (uVar3 & 0xffffffc0) == 0x2000)) {
          uVar4 = (uint)puVar6[uVar3];
LAB_00233ad2:
          uVar7 = uVar4;
          if (0xfff < uVar4) {
            uVar4 = uVar4 & 0x3e0;
            uVar11 = uVar4 * 0x10000 + 0x2000c0;
            if (uVar4 < 0x180) {
              uVar11 = uVar4 + 0x20;
            }
            break;
          }
        }
        else {
          uVar4 = 1;
          if (uVar3 == 0xffff) {
            uVar4 = 0xfca8;
          }
          uVar7 = 3;
          if (uVar3 != 0xfffe) goto LAB_00233ad2;
        }
        if (uVar8 < uVar7) {
          uVar11 = 0xc0;
          break;
        }
        uVar2 = nextPair(table_00,uVar3,uVar7,local_48,(uint8_t *)0x0,&local_60,&rightLength);
        uVar11 = getSecondaries(uVar8,uVar2);
      }
      if (uVar10 != uVar11) {
        uVar3 = uVar10 & 0xffff;
        uVar4 = uVar11 & 0xffff;
        if (uVar3 != uVar4) {
          if ((local_54 >> 0xb & 1) != 0) {
            return -2;
          }
          goto LAB_00233ded;
        }
        if (uVar10 == 2) break;
        uVar2 = uVar10 >> 0x10;
        uVar11 = uVar11 >> 0x10;
        goto joined_r0x0023399f;
      }
      uVar11 = 0;
      uVar2 = 0;
    } while (uVar10 != 2);
  }
  if ((local_54 >> 10 & 1) != 0) {
    bVar12 = local_3c < 0x1000;
    uVar11 = 0;
    local_60 = 0;
    local_5c = 0;
    uVar2 = 0;
joined_r0x00233be6:
    do {
      if (uVar2 == 0) {
        lVar5 = (long)local_5c;
        if (local_5c != local_58) {
          local_5c = local_5c + 1;
          UVar1 = left[lVar5];
          uVar3 = (uint)(ushort)UVar1;
          puVar6 = table_00;
          if (((ushort)UVar1 < 0x180) || (puVar6 = local_50, (UVar1 & 0xffc0U) == 0x2000)) {
            uVar2 = (uint32_t)puVar6[uVar3];
LAB_00233c2a:
            uVar4 = uVar2;
            if (uVar2 < 0xc00) goto LAB_00233c56;
          }
          else {
            uVar2 = 1;
            if (uVar3 == 0xffff) {
              uVar2 = 0xfca8;
            }
            uVar4 = 3;
            if (uVar3 != 0xfffe) goto LAB_00233c2a;
LAB_00233c56:
            uVar2 = nextPair(table_00,uVar3,uVar4,left,(uint8_t *)0x0,&local_5c,&local_58);
          }
          uVar2 = getCases(uVar8,bVar12,uVar2);
          goto joined_r0x00233be6;
        }
        uVar2 = 2;
      }
      for (; uVar11 == 0; uVar11 = getCases(uVar8,bVar12,uVar11)) {
        lVar5 = (long)local_60;
        if (local_60 == rightLength) {
          uVar11 = 2;
          break;
        }
        local_60 = local_60 + 1;
        UVar1 = local_48[lVar5];
        uVar3 = (uint)(ushort)UVar1;
        puVar6 = table_00;
        if (((ushort)UVar1 < 0x180) || (puVar6 = local_50, (UVar1 & 0xffc0U) == 0x2000)) {
          uVar11 = (uint32_t)puVar6[uVar3];
LAB_00233cdc:
          uVar4 = uVar11;
          if (uVar11 < 0xc00) goto LAB_00233d08;
        }
        else {
          uVar11 = 1;
          if (uVar3 == 0xffff) {
            uVar11 = 0xfca8;
          }
          uVar4 = 3;
          if (uVar3 != 0xfffe) goto LAB_00233cdc;
LAB_00233d08:
          uVar11 = nextPair(table_00,uVar3,uVar4,local_48,(uint8_t *)0x0,&local_60,&rightLength);
        }
      }
      if (uVar2 != uVar11) {
        uVar3 = uVar2 & 0xffff;
        uVar4 = uVar11 & 0xffff;
        if (uVar3 != uVar4) {
          if ((local_54 >> 8 & 1) == 0) goto LAB_00233ded;
          uVar8 = (uVar3 < uVar4) - 1;
          goto LAB_00233df5;
        }
        if (uVar2 == 2) break;
        uVar2 = uVar2 >> 0x10;
        uVar11 = uVar11 >> 0x10;
        goto joined_r0x00233be6;
      }
      uVar11 = 0;
      bVar13 = uVar2 != 2;
      uVar2 = 0;
    } while (bVar13);
  }
  if (0x1fff < local_3c) {
    bVar12 = (local_54 & 0x600) == 0x200;
    uVar11 = 0;
    local_60 = 0;
    local_5c = 0;
    uVar2 = 0;
joined_r0x002337d9:
    do {
      if (uVar2 == 0) {
        lVar5 = (long)local_5c;
        if (local_5c != local_58) {
          local_5c = local_5c + 1;
          UVar1 = left[lVar5];
          uVar3 = (uint)(ushort)UVar1;
          puVar6 = table_00;
          if (((ushort)UVar1 < 0x180) || (puVar6 = local_50, (UVar1 & 0xffc0U) == 0x2000)) {
            uVar2 = (uint32_t)puVar6[uVar3];
LAB_0023381d:
            uVar4 = uVar2;
            if (uVar2 < 0xc00) goto LAB_00233849;
          }
          else {
            uVar2 = 1;
            if (uVar3 == 0xffff) {
              uVar2 = 0xfca8;
            }
            uVar4 = 3;
            if (uVar3 != 0xfffe) goto LAB_0023381d;
LAB_00233849:
            uVar2 = nextPair(table_00,uVar3,uVar4,left,(uint8_t *)0x0,&local_5c,&local_58);
          }
          uVar2 = getTertiaries(uVar8,bVar12,uVar2);
          goto joined_r0x002337d9;
        }
        uVar2 = 2;
      }
      for (; uVar11 == 0; uVar11 = getTertiaries(uVar8,bVar12,uVar11)) {
        lVar5 = (long)local_60;
        if (local_60 == rightLength) {
          uVar11 = 2;
          break;
        }
        local_60 = local_60 + 1;
        UVar1 = local_48[lVar5];
        uVar3 = (uint)(ushort)UVar1;
        puVar6 = table_00;
        if (((ushort)UVar1 < 0x180) || (puVar6 = local_50, (UVar1 & 0xffc0U) == 0x2000)) {
          uVar11 = (uint32_t)puVar6[uVar3];
LAB_002338cf:
          uVar4 = uVar11;
          if (uVar11 < 0xc00) goto LAB_002338fb;
        }
        else {
          uVar11 = 1;
          if (uVar3 == 0xffff) {
            uVar11 = 0xfca8;
          }
          uVar4 = 3;
          if (uVar3 != 0xfffe) goto LAB_002338cf;
LAB_002338fb:
          uVar11 = nextPair(table_00,uVar3,uVar4,local_48,(uint8_t *)0x0,&local_60,&rightLength);
        }
      }
      if (uVar2 != uVar11) {
        uVar3 = uVar2 & 0xffff;
        uVar4 = uVar11 & 0xffff;
        if (uVar3 != uVar4) {
          if ((local_54 & 0x700) == 0x300) {
            if (3 < uVar3) {
              uVar3 = uVar3 ^ 0x18;
            }
            if (3 < uVar4) {
              uVar4 = uVar4 ^ 0x18;
            }
          }
          goto LAB_00233ded;
        }
        if (uVar2 == 2) break;
        uVar2 = uVar2 >> 0x10;
        uVar11 = uVar11 >> 0x10;
        goto joined_r0x002337d9;
      }
      uVar11 = 0;
      bVar13 = uVar2 != 2;
      uVar2 = 0;
    } while (bVar13);
    if (0x2fff < local_3c) {
      uVar10 = 0;
      local_60 = 0;
      local_5c = 0;
      uVar7 = 0;
LAB_00233e14:
      if (uVar7 == 0) {
        lVar5 = (long)local_5c;
        if (local_5c == local_58) {
          uVar7 = 2;
        }
        else {
          local_5c = local_5c + 1;
          UVar1 = left[lVar5];
          uVar3 = (uint)(ushort)UVar1;
          puVar6 = table_00;
          if (((ushort)UVar1 < 0x180) || (puVar6 = local_50, (UVar1 & 0xffc0U) == 0x2000)) {
            uVar4 = (uint)puVar6[uVar3];
LAB_00233e5a:
            uVar7 = uVar4;
            if (uVar4 < 0xc00) goto LAB_00233e85;
          }
          else {
            uVar4 = 1;
            if (uVar3 == 0xffff) {
              uVar4 = 0xfca8;
            }
            uVar7 = 3;
            if (uVar3 != 0xfffe) goto LAB_00233e5a;
LAB_00233e85:
            uVar4 = nextPair(table_00,uVar3,uVar7,left,(uint8_t *)0x0,&local_5c,&local_58);
            if (0xffff < uVar4) {
              if (uVar8 < (uVar4 & 0xffff)) {
                uVar7 = 0xfc00fc00;
                goto LAB_00233f06;
              }
              uVar7 = uVar4 & 0xfff8fff8;
              goto LAB_00233e14;
            }
          }
          if (uVar4 < 0x1000) {
            if (uVar4 <= uVar8) {
              uVar7 = uVar4 & 0xff8;
              if (uVar4 < 0xc00) {
                uVar7 = uVar4;
              }
              goto LAB_00233e14;
            }
            uVar7 = 0xfc00;
          }
          else {
            uVar7 = (uint)((uVar4 & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00;
          }
        }
      }
LAB_00233f06:
      if (uVar10 == 0) {
        lVar5 = (long)local_60;
        if (local_60 == rightLength) {
          uVar10 = 2;
          goto LAB_0023400c;
        }
        local_60 = local_60 + 1;
        UVar1 = local_48[lVar5];
        uVar3 = (uint)(ushort)UVar1;
        puVar6 = table_00;
        if (((ushort)UVar1 < 0x180) || (puVar6 = local_50, (UVar1 & 0xffc0U) == 0x2000)) {
          uVar4 = (uint)puVar6[uVar3];
LAB_00233f51:
          uVar10 = uVar4;
          if (uVar4 < 0xc00) goto LAB_00233f7c;
        }
        else {
          uVar4 = 1;
          if (uVar3 == 0xffff) {
            uVar4 = 0xfca8;
          }
          uVar10 = 3;
          if (uVar3 != 0xfffe) goto LAB_00233f51;
LAB_00233f7c:
          uVar4 = nextPair(table_00,uVar3,uVar10,local_48,(uint8_t *)0x0,&local_60,&rightLength);
          if (0xffff < uVar4) {
            if (uVar8 < (uVar4 & 0xffff)) {
              uVar10 = 0xfc00fc00;
              goto LAB_0023400c;
            }
            uVar10 = uVar4 & 0xfff8fff8;
            goto LAB_00233f06;
          }
        }
        if (0xfff < uVar4) {
          uVar10 = (uint)((uVar4 & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00;
          goto LAB_0023400c;
        }
        if (uVar8 < uVar4) {
          uVar10 = 0xfc00;
          goto LAB_0023400c;
        }
        uVar10 = uVar4 & 0xff8;
        if (uVar4 < 0xc00) {
          uVar10 = uVar4;
        }
        goto LAB_00233f06;
      }
LAB_0023400c:
      if (uVar7 == uVar10) {
        uVar10 = 0;
        bVar12 = uVar7 == 2;
        uVar7 = 0;
        if (bVar12) {
          return 0;
        }
      }
      else {
        uVar3 = uVar7 & 0xffff;
        uVar4 = uVar10 & 0xffff;
        if (uVar3 != (uVar10 & 0xffff)) {
LAB_00233ded:
          uVar8 = -(uint)(uVar3 < uVar4);
LAB_00233df5:
          return uVar8 | 1;
        }
        if (uVar7 == 2) {
          return 0;
        }
        uVar10 = uVar10 >> 0x10;
        uVar7 = uVar7 >> 0x10;
      }
      goto LAB_00233e14;
    }
  }
  return 0;
}

Assistant:

int32_t
CollationFastLatin::compareUTF16(const uint16_t *table, const uint16_t *primaries, int32_t options,
                                 const UChar *left, int32_t leftLength,
                                 const UChar *right, int32_t rightLength) {
    // This is a modified copy of CollationCompare::compareUpToQuaternary(),
    // optimized for common Latin text.
    // Keep them in sync!
    // Keep compareUTF16() and compareUTF8() in sync very closely!

    U_ASSERT((table[0] >> 8) == VERSION);
    table += (table[0] & 0xff);  // skip the header
    uint32_t variableTop = (uint32_t)options >> 16;  // see getOptions()
    options &= 0xffff;  // needed for CollationSettings::getStrength() to work

    // Check for supported characters, fetch mini CEs, and compare primaries.
    int32_t leftIndex = 0, rightIndex = 0;
    /**
     * Single mini CE or a pair.
     * The current mini CE is in the lower 16 bits, the next one is in the upper 16 bits.
     * If there is only one, then it is in the lower bits, and the upper bits are 0.
     */
    uint32_t leftPair = 0, rightPair = 0;
    for(;;) {
        // We fetch CEs until we get a non-ignorable primary or reach the end.
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            if(c <= LATIN_MAX) {
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                leftPair = table[c];
            } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                leftPair = table[c - PUNCT_START + LATIN_LIMIT];
            } else {
                leftPair = lookup(table, c);
            }
            if(leftPair >= MIN_SHORT) {
                leftPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(leftPair > variableTop) {
                leftPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                if(leftPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                leftPair = getPrimaries(variableTop, leftPair);
            }
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            if(c <= LATIN_MAX) {
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                rightPair = table[c];
            } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                rightPair = table[c - PUNCT_START + LATIN_LIMIT];
            } else {
                rightPair = lookup(table, c);
            }
            if(rightPair >= MIN_SHORT) {
                rightPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(rightPair > variableTop) {
                rightPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                if(rightPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                rightPair = getPrimaries(variableTop, rightPair);
            }
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftPrimary = leftPair & 0xffff;
        uint32_t rightPrimary = rightPair & 0xffff;
        if(leftPrimary != rightPrimary) {
            // Return the primary difference.
            return (leftPrimary < rightPrimary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    // In the following, we need to re-fetch each character because we did not buffer the CEs,
    // but we know that the string is well-formed and
    // only contains supported characters and mappings.

    // We might skip the secondary level but continue with the case level
    // which is turned on separately.
    if(CollationSettings::getStrength(options) >= UCOL_SECONDARY) {
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                if(c <= LATIN_MAX) {
                    leftPair = table[c];
                } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                    leftPair = table[c - PUNCT_START + LATIN_LIMIT];
                } else {
                    leftPair = lookup(table, c);
                }
                if(leftPair >= MIN_SHORT) {
                    leftPair = getSecondariesFromOneShortCE(leftPair);
                    break;
                } else if(leftPair > variableTop) {
                    leftPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                    leftPair = getSecondaries(variableTop, leftPair);
                }
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                if(c <= LATIN_MAX) {
                    rightPair = table[c];
                } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
                    rightPair = table[c - PUNCT_START + LATIN_LIMIT];
                } else {
                    rightPair = lookup(table, c);
                }
                if(rightPair >= MIN_SHORT) {
                    rightPair = getSecondariesFromOneShortCE(rightPair);
                    break;
                } else if(rightPair > variableTop) {
                    rightPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                    rightPair = getSecondaries(variableTop, rightPair);
                }
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftSecondary = leftPair & 0xffff;
            uint32_t rightSecondary = rightPair & 0xffff;
            if(leftSecondary != rightSecondary) {
                if((options & CollationSettings::BACKWARD_SECONDARY) != 0) {
                    // Full support for backwards secondary requires backwards contraction matching
                    // and moving backwards between merge separators.
                    return BAIL_OUT_RESULT;
                }
                return (leftSecondary < rightSecondary) ? UCOL_LESS : UCOL_GREATER;
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }

    if((options & CollationSettings::CASE_LEVEL) != 0) {
        UBool strengthIsPrimary = CollationSettings::getStrength(options) == UCOL_PRIMARY;
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
                if(leftPair < MIN_LONG) {
                    leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
                }
                leftPair = getCases(variableTop, strengthIsPrimary, leftPair);
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
                if(rightPair < MIN_LONG) {
                    rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
                }
                rightPair = getCases(variableTop, strengthIsPrimary, rightPair);
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftCase = leftPair & 0xffff;
            uint32_t rightCase = rightPair & 0xffff;
            if(leftCase != rightCase) {
                if((options & CollationSettings::UPPER_FIRST) == 0) {
                    return (leftCase < rightCase) ? UCOL_LESS : UCOL_GREATER;
                } else {
                    return (leftCase < rightCase) ? UCOL_GREATER : UCOL_LESS;
                }
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }
    if(CollationSettings::getStrength(options) <= UCOL_SECONDARY) { return UCOL_EQUAL; }

    // Remove the case bits from the tertiary weight when caseLevel is on or caseFirst is off.
    UBool withCaseBits = CollationSettings::isTertiaryWithCaseBits(options);

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
            }
            leftPair = getTertiaries(variableTop, withCaseBits, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
            }
            rightPair = getTertiaries(variableTop, withCaseBits, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftTertiary = leftPair & 0xffff;
        uint32_t rightTertiary = rightPair & 0xffff;
        if(leftTertiary != rightTertiary) {
            if(CollationSettings::sortsTertiaryUpperCaseFirst(options)) {
                // Pass through EOS and MERGE_WEIGHT
                // and keep real tertiary weights larger than the MERGE_WEIGHT.
                // Tertiary CEs (secondary ignorables) are not supported in fast Latin.
                if(leftTertiary > MERGE_WEIGHT) {
                    leftTertiary ^= CASE_MASK;
                }
                if(rightTertiary > MERGE_WEIGHT) {
                    rightTertiary ^= CASE_MASK;
                }
            }
            return (leftTertiary < rightTertiary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    if(CollationSettings::getStrength(options) <= UCOL_TERTIARY) { return UCOL_EQUAL; }

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, left, NULL, leftIndex, leftLength);
            }
            leftPair = getQuaternaries(variableTop, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= LATIN_MAX) ? table[c] : lookup(table, c);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, right, NULL, rightIndex, rightLength);
            }
            rightPair = getQuaternaries(variableTop, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftQuaternary = leftPair & 0xffff;
        uint32_t rightQuaternary = rightPair & 0xffff;
        if(leftQuaternary != rightQuaternary) {
            return (leftQuaternary < rightQuaternary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    return UCOL_EQUAL;
}